

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

char * get_GLSL_srcarg_varname(Context *ctx,size_t idx,char *buf,size_t len)

{
  char *pcVar1;
  size_t in_R8;
  
  pcVar1 = get_GLSL_varname_in_buf
                     (ctx,ctx->source_args[idx].regtype,ctx->source_args[idx].regnum,buf,in_R8);
  return pcVar1;
}

Assistant:

static const char *get_GLSL_srcarg_varname(Context *ctx, const size_t idx,
                                           char *buf, size_t len)
{
    if (idx >= STATICARRAYLEN(ctx->source_args))
    {
        fail(ctx, "Too many source args");
        *buf = '\0';
        return buf;
    } // if

    const SourceArgInfo *arg = &ctx->source_args[idx];
    return get_GLSL_varname_in_buf(ctx, arg->regtype, arg->regnum, buf, len);
}